

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c++
# Opt level: O2

Date __thiscall kj::anon_unknown_10::PosixClock::now(PosixClock *this)

{
  int iVar1;
  Fault f;
  timespec ts;
  Fault FStack_28;
  timespec local_20;
  
  do {
    iVar1 = clock_gettime(this->clockId,&local_20);
    if (-1 < iVar1) goto LAB_0040da8e;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&FStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/time.c++"
               ,0xc0,iVar1,"clock_gettime(clockId, &ts)","");
    kj::_::Debug::Fault::fatal(&FStack_28);
  }
LAB_0040da8e:
  return (Date)(local_20.tv_sec * 1000000000 + local_20.tv_nsec);
}

Assistant:

Date now() const override {
    struct timespec ts;
    KJ_SYSCALL(clock_gettime(clockId, &ts));
    return UNIX_EPOCH + ts.tv_sec * kj::SECONDS + ts.tv_nsec * kj::NANOSECONDS;
  }